

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::GetBooleanValue(cmConditionEvaluator *this,cmExpandedCommandArgument *arg)

{
  bool bVar1;
  string *psVar2;
  char *__nptr;
  string_view val;
  cmValue local_58;
  cmValue def;
  double d;
  char *end;
  char *local_38;
  string_view local_30;
  cmExpandedCommandArgument *local_20;
  cmExpandedCommandArgument *arg_local;
  cmConditionEvaluator *this_local;
  
  local_20 = arg;
  arg_local = (cmExpandedCommandArgument *)this;
  psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
  local_30 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2)
  ;
  bVar1 = cmIsOn(local_30);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(local_20);
    val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    local_38 = val._M_str;
    end = (char *)val._M_len;
    bVar1 = cmIsOff(val);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = cmExpandedCommandArgument::empty(local_20);
      if (!bVar1) {
        cmExpandedCommandArgument::GetValue_abi_cxx11_(local_20);
        __nptr = (char *)std::__cxx11::string::c_str();
        def.Value = (string *)strtod(__nptr,(char **)&d);
        if (*(char *)d == '\0') {
          return (double)def.Value != 0.0;
        }
      }
      local_58 = GetDefinitionIfUnquoted(this,local_20);
      bVar1 = cmValue::IsOff(&local_58);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValue(
  cmExpandedCommandArgument& arg) const
{
  // Check basic and named constants.
  if (cmIsOn(arg.GetValue())) {
    return true;
  }
  if (cmIsOff(arg.GetValue())) {
    return false;
  }

  // Check for numbers.
  if (!arg.empty()) {
    char* end;
    const double d = std::strtod(arg.GetValue().c_str(), &end);
    if (*end == '\0') {
      // The whole string is a number.  Use C conversion to bool.
      return static_cast<bool>(d);
    }
  }

  // Check definition.
  cmValue def = this->GetDefinitionIfUnquoted(arg);
  return !def.IsOff();
}